

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void RAWToUVJRow_C(uint8_t *src_rgb0,int src_stride_rgb,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long local_58;
  
  lVar6 = (long)src_stride_rgb;
  local_58 = 0;
  for (iVar4 = 0; iVar4 < width + -1; iVar4 = iVar4 + 2) {
    uVar3 = (uint8_t)(((uint)*src_rgb0 + (uint)src_rgb0[lVar6] + 1 >> 1 & 0xff) +
                      ((uint)src_rgb0[3] + (uint)src_rgb0[lVar6 + 3] + 1 >> 1 & 0xff) + 1 >> 1);
    uVar2 = (uint8_t)(((uint)src_rgb0[1] + (uint)src_rgb0[lVar6 + 1] + 1 >> 1 & 0xff) +
                      ((uint)src_rgb0[4] + (uint)src_rgb0[lVar6 + 4] + 1 >> 1 & 0xff) + 1 >> 1);
    uVar1 = (uint8_t)(((uint)src_rgb0[2] + (uint)src_rgb0[lVar6 + 2] + 1 >> 1 & 0xff) +
                      ((uint)src_rgb0[5] + (uint)src_rgb0[lVar6 + 5] + 1 >> 1 & 0xff) + 1 >> 1);
    iVar5 = libyuv::RGBToUJ(uVar3,uVar2,uVar1);
    dst_u[local_58] = (uint8_t)iVar5;
    iVar5 = libyuv::RGBToVJ(uVar3,uVar2,uVar1);
    dst_v[local_58] = (uint8_t)iVar5;
    src_rgb0 = src_rgb0 + 6;
    local_58 = local_58 + 1;
  }
  if ((width & 1U) != 0) {
    uVar3 = (uint8_t)((uint)*src_rgb0 + (uint)src_rgb0[lVar6] + 1 >> 1);
    uVar2 = (uint8_t)((uint)src_rgb0[1] + (uint)src_rgb0[lVar6 + 1] + 1 >> 1);
    uVar1 = (uint8_t)((uint)src_rgb0[2] + (uint)src_rgb0[lVar6 + 2] + 1 >> 1);
    iVar4 = libyuv::RGBToUJ(uVar3,uVar2,uVar1);
    dst_u[local_58] = (uint8_t)iVar4;
    iVar4 = libyuv::RGBToVJ(uVar3,uVar2,uVar1);
    dst_v[local_58] = (uint8_t)iVar4;
  }
  return;
}

Assistant:

void RGB565ToYRow_C(const uint8_t* src_rgb565, uint8_t* dst_y, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_rgb565[0] & 0x1f;
    uint8_t g = (src_rgb565[0] >> 5) | ((src_rgb565[1] & 0x07) << 3);
    uint8_t r = src_rgb565[1] >> 3;
    b = (b << 3) | (b >> 2);
    g = (g << 2) | (g >> 4);
    r = (r << 3) | (r >> 2);
    dst_y[0] = RGBToY(r, g, b);
    src_rgb565 += 2;
    dst_y += 1;
  }
}